

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_patch.c
# Opt level: O2

int json_patch_apply_add_replace
              (json_object **res,json_object *patch_elem,char *path,int add,
              json_patch_error *patch_error)

{
  int iVar1;
  json_object *value_00;
  int *piVar2;
  char *pcVar3;
  int add_local;
  json_object *value;
  
  add_local = add;
  iVar1 = json_object_object_get_ex(patch_elem,"value",&value);
  if (iVar1 == 0) {
    patch_error->errno_code = 0x16;
    patch_error->errmsg = "Patch object does not contain a \'value\' field";
    piVar2 = __errno_location();
LAB_00109f5a:
    *piVar2 = 0;
    iVar1 = -1;
  }
  else {
    if (add == 0) {
      iVar1 = json_pointer_get(*res,path,(json_object **)0x0);
      if (iVar1 != 0) {
        piVar2 = __errno_location();
        iVar1 = *piVar2;
        patch_error->errno_code = iVar1;
        pcVar3 = "Invalid path field";
        if (iVar1 == 2) {
          pcVar3 = "Did not find element referenced by path field";
        }
        patch_error->errmsg = pcVar3;
        goto LAB_00109f5a;
      }
    }
    value_00 = json_object_get(value);
    iVar1 = json_pointer_set_with_array_cb
                      (res,path,value_00,json_object_array_insert_idx_cb,&add_local);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      piVar2 = __errno_location();
      patch_error->errno_code = *piVar2;
      patch_error->errmsg = "Failed to set value at path referenced by \'path\' field";
      *piVar2 = 0;
      json_object_put(value);
    }
  }
  return iVar1;
}

Assistant:

static int json_patch_apply_add_replace(struct json_object **res,
                                        struct json_object *patch_elem,
                                        const char *path, int add, struct json_patch_error *patch_error)
{
	struct json_object *value;
	int rc;

	if (!json_object_object_get_ex(patch_elem, "value", &value)) {
		_set_err(EINVAL, "Patch object does not contain a 'value' field");
		return -1;
	}
	/* if this is a replace op, then we need to make sure it exists before replacing */
	if (!add && json_pointer_get(*res, path, NULL)) {
		_set_err_from_ptrget(errno, "path");
		return -1;
	}

	rc = json_pointer_set_with_array_cb(res, path, json_object_get(value),
					    json_object_array_insert_idx_cb, &add);
	if (rc)
	{
		_set_err(errno, "Failed to set value at path referenced by 'path' field");
		json_object_put(value);
	}

	return rc;
}